

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::saveProgramOptionsHash(CLIntercept *this,cl_program program,char *options)

{
  key_type *__k;
  mapped_type *pmVar1;
  CLIntercept *in_RDX;
  long in_RSI;
  uint64_t hash;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((in_RSI != 0) && (in_RDX != (CLIntercept *)0x0)) {
    strlen((char *)in_RDX);
    __k = (key_type *)
          computeHash(in_RDX,in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
    pmVar1 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[](in_stack_ffffffffffffffe0,__k);
    pmVar1->OptionsHash = (uint64_t)__k;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f8900);
  return;
}

Assistant:

void CLIntercept::saveProgramOptionsHash(
    const cl_program program,
    const char* options )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( program != NULL && options != NULL )
    {
        uint64_t hash = computeHash(
            options,
            strlen( options ) );

        m_ProgramInfoMap[ program ].OptionsHash = hash;
    }
}